

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

double getCVal(reg_object fit,char *method)

{
  int iVar1;
  double local_20;
  double crit;
  char *method_local;
  reg_object fit_local;
  
  iVar1 = strcmp(method,"aic");
  if ((iVar1 == 0) || (iVar1 = strcmp(method,"AIC"), iVar1 == 0)) {
    local_20 = fit->aic;
  }
  else {
    iVar1 = strcmp(method,"bic");
    if ((iVar1 == 0) || (iVar1 = strcmp(method,"BIC"), iVar1 == 0)) {
      local_20 = fit->bic;
    }
    else {
      iVar1 = strcmp(method,"aicc");
      if (((iVar1 != 0) && (iVar1 = strcmp(method,"AICc"), iVar1 != 0)) &&
         (iVar1 = strcmp(method,"AICc"), iVar1 != 0)) {
        printf("Only three criterions are accepted - aic, bic and aicc \n");
        exit(-1);
      }
      local_20 = fit->aicc;
    }
  }
  return local_20;
}

Assistant:

static double getCVal(reg_object fit,const char *method) {
    double crit;

    if(!strcmp(method,"aic") || !strcmp(method,"AIC")) {
        crit = fit->aic;
    } else if(!strcmp(method,"bic") || !strcmp(method,"BIC")) {
        crit = fit->bic;
    } else if(!strcmp(method,"aicc") || !strcmp(method,"AICc") || !strcmp(method,"AICc")) {
        crit = fit->aicc;
    } else {
        printf("Only three criterions are accepted - aic, bic and aicc \n");
        exit(-1);
    }

    return crit;
}